

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerfHint.cpp
# Opt level: O0

void WritePerfHint(PerfHints hint,FunctionBody *functionBody,uint byteCodeOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LPCWSTR pWVar4;
  char16_t *pcVar5;
  char16 *pcVar6;
  WCHAR local_258 [4];
  TCHAR shortName [255];
  ULONG local_50;
  LONG columnNumber;
  ULONG lineNumber;
  int level;
  PerfHintItem item;
  uint byteCodeOffset_local;
  FunctionBody *functionBody_local;
  PerfHints hint_local;
  
  item._28_4_ = byteCodeOffset;
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PerfHint.cpp"
                       ,0x10,"(functionBody)","functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (PolymorphicInilineCap < hint) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PerfHint.cpp"
                       ,0x11,"(((uint)hint) < (sizeof(*__countof_helper(s_perfHintContainer)) + 0))"
                       ,"((uint)hint) < _countof(s_perfHintContainer)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  _lineNumber = s_perfHintContainer[hint].description;
  item.description = s_perfHintContainer[hint].consequences;
  item.consequences = s_perfHintContainer[hint].suggestion;
  item.suggestion = *(LPCWSTR *)&s_perfHintContainer[hint].level;
  columnNumber = DAT_01eca2b8;
  if (2 < DAT_01eca2b8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PerfHint.cpp"
                       ,0x16,"(level <= (int)PerfHintLevels::VERBOSE)",
                       "level <= (int)PerfHintLevels::VERBOSE");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((int)item.suggestion <= columnNumber) {
    local_50 = Js::ParseableFunctionInfo::GetLineNumber(&functionBody->super_ParseableFunctionInfo);
    register0x00000000 =
         Js::ParseableFunctionInfo::GetColumnNumber(&functionBody->super_ParseableFunctionInfo);
    if (item._28_4_ != -1) {
      Js::FunctionBody::GetLineCharOffset
                (functionBody,item._28_4_,&local_50,(LONG *)(shortName + 0xfe),false);
      local_50 = local_50 + 1;
      register0x00000000 = stack0xffffffffffffffac + 1;
    }
    pWVar4 = Js::ParseableFunctionInfo::GetSourceName(&functionBody->super_ParseableFunctionInfo);
    Js::FunctionBody::GetShortNameFromUrl(pWVar4,local_258,0xff);
    pWVar4 = _lineNumber;
    pcVar5 = L"Optimized";
    if (((ulong)item.suggestion & 0x100000000) != 0) {
      pcVar5 = L"Not optimized";
    }
    pcVar6 = Js::ParseableFunctionInfo::GetExternalDisplayName
                       (&functionBody->super_ParseableFunctionInfo);
    Output::Trace(PerfHintPhase,
                  L"%s : %s {\n      Function : %s [%s @ %u, %u]\n  Consequences : %s\n    Suggestion : %s\n}\n"
                  ,pcVar5,pWVar4,pcVar6,local_258,local_50,stack0xffffffffffffffac,item.description,
                  item.consequences);
    Output::Flush();
  }
  return;
}

Assistant:

void WritePerfHint(PerfHints hint, Js::FunctionBody * functionBody, uint byteCodeOffset /*= Js::Constants::NoByteCodeOffset*/)
{
    Assert(functionBody);
    Assert(((uint)hint) < _countof(s_perfHintContainer));

    PerfHintItem item = s_perfHintContainer[(uint)hint];

    int level = CONFIG_FLAG(PerfHintLevel);
    Assert(level <= (int)PerfHintLevels::VERBOSE);

    if ((int)item.level <= level)
    {
        ULONG lineNumber = functionBody->GetLineNumber();
        LONG columnNumber = functionBody->GetColumnNumber();
        if (byteCodeOffset != Js::Constants::NoByteCodeOffset)
        {
            functionBody->GetLineCharOffset(byteCodeOffset, &lineNumber, &columnNumber, false /*canAllocateLineCache*/);

            // returned values are 0-based. Adjusting.
            lineNumber++;
            columnNumber++;
        }

        // We will print the short name.
        TCHAR shortName[255];
        Js::FunctionBody::GetShortNameFromUrl(functionBody->GetSourceName(), shortName, 255);

        OUTPUT_TRACE(Js::PerfHintPhase, _u("%s : %s {\n      Function : %s [%s @ %u, %u]\n  Consequences : %s\n    Suggestion : %s\n}\n"),
            item.isNotOptimized ? _u("Not optimized") : _u("Optimized"),
            item.description,
            functionBody->GetExternalDisplayName(),
            shortName,
            lineNumber,
            columnNumber,
            item.consequences,
            item.suggestion);
        Output::Flush();
    }
}